

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O2

bool chrono::utils::WriteCheckpoint(ChSystem *system,string *filename)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  undefined2 uVar8;
  int iVar9;
  CSV_writer *pCVar10;
  uint uVar11;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  vector<double,_std::allocator<double>_> dims;
  shared_ptr<chrono::ChBody> body;
  int n_shapes;
  shared_ptr<chrono::collision::ChCollisionShape> shape;
  int ctype;
  ChCoordsys<double> csys;
  string tab;
  CSV_writer csv;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_290;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_278;
  int local_264;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_260;
  undefined1 local_250 [20];
  uint local_23c;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *local_238;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *local_230;
  undefined1 local_228 [56];
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  CSV_writer local_1c8;
  
  std::__cxx11::string::string((string *)local_228," ",(allocator *)&local_1e8);
  CSV_writer::CSV_writer(&local_1c8,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::string((string *)&local_1e8,"    ",(allocator *)local_228);
  local_1f0 = filename;
  iVar9 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])(system)
  ;
  local_23c = (uint)(iVar9 != 0);
  pCVar10 = CSV_writer::operator<<(&local_1c8,(int *)&local_23c);
  std::endl<char,std::char_traits<char>>((ostream *)&pCVar10->m_ss);
  local_238 = &((system->assembly).bodylist.
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  p_Var13 = &((system->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  do {
    p_Var12 = local_238;
    if (p_Var13 == local_238) {
      std::__cxx11::string::string((string *)local_228,"",(allocator *)&local_290);
      CSV_writer::write_to_file(&local_1c8,local_1f0,(string *)local_228);
      std::__cxx11::string::~string((string *)local_228);
LAB_00e3b65d:
      std::__cxx11::string::~string((string *)&local_1e8);
      CSV_writer::~CSV_writer(&local_1c8);
      return p_Var13 == p_Var12;
    }
    local_230 = p_Var13;
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_278,p_Var13);
    local_228._0_4_ = ((local_278._M_ptr)->super_ChPhysicsItem).super_ChObj.m_identifier;
    pCVar10 = CSV_writer::operator<<(&local_1c8,(int *)local_228);
    bVar7 = ChBody::GetBodyFixed(local_278._M_ptr);
    local_290._M_ptr = (element_type *)CONCAT71(local_290._M_ptr._1_7_,bVar7);
    pCVar10 = CSV_writer::operator<<(pCVar10,(bool *)&local_290);
    iVar9 = (*((local_278._M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])();
    local_250[0] = (undefined1)iVar9;
    pCVar10 = CSV_writer::operator<<(pCVar10,(bool *)local_250);
    CSV_writer::operator<<(pCVar10,&local_1e8);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               local_228,
               &((local_278._M_ptr)->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    uVar8 = (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 0xf0))();
    local_250[0] = (undefined1)uVar8;
    local_250[1] = (undefined1)((ushort)uVar8 >> 8);
    pCVar10 = CSV_writer::operator<<(&local_1c8,(short *)local_250);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_290,
               &((local_278._M_ptr)->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    iVar9 = (*(local_290._M_ptr)->_vptr_ChCollisionModel[0x20])();
    local_260._M_ptr._0_2_ = (undefined2)iVar9;
    pCVar10 = CSV_writer::operator<<(pCVar10,(short *)&local_260);
    CSV_writer::operator<<(pCVar10,&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
    local_290._M_ptr = (element_type *)((local_278._M_ptr)->variables).mass;
    pCVar10 = CSV_writer::operator<<(&local_1c8,(double *)&local_290);
    ChBody::GetInertiaXX(local_278._M_ptr);
    pCVar10 = operator<<(pCVar10,(ChVector<double> *)local_228);
    CSV_writer::operator<<(pCVar10,&local_1e8);
    pCVar10 = operator<<(&local_1c8,
                         &((local_278._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.coord.pos);
    pCVar10 = operator<<(pCVar10,&((local_278._M_ptr)->super_ChBodyFrame).
                                  super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot);
    CSV_writer::operator<<(pCVar10,&local_1e8);
    pCVar10 = operator<<(&local_1c8,
                         &((local_278._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>.
                          coord_dt.pos);
    pCVar10 = operator<<(pCVar10,&((local_278._M_ptr)->super_ChBodyFrame).
                                  super_ChFrameMoving<double>.coord_dt.rot);
    CSV_writer::operator<<(pCVar10,&local_1e8);
    std::endl<char,std::char_traits<char>>((ostream *)&local_1c8.m_ss);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               local_228,
               &((local_278._M_ptr)->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    lVar2 = *(long *)(CONCAT44(local_228._4_4_,local_228._0_4_) + 0x28);
    lVar3 = *(long *)(CONCAT44(local_228._4_4_,local_228._0_4_) + 0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
    local_264 = (int)((ulong)(lVar2 - lVar3) >> 4);
    pCVar10 = CSV_writer::operator<<(&local_1c8,&local_264);
    std::endl<char,std::char_traits<char>>((ostream *)&pCVar10->m_ss);
    uVar11 = 0;
    while( true ) {
      if (local_264 <= (int)uVar11) break;
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   local_228,
                   &((local_278._M_ptr)->collision_model).
                    super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      collision::ChCollisionModel::GetShape((ChCollisionModel *)local_250,local_228._0_4_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_290,
                   &((local_278._M_ptr)->collision_model).
                    super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_290._M_ptr)->_vptr_ChCollisionModel[0x29])
                ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                 local_228,local_290._M_ptr,(ulong)uVar11);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
      pCVar10 = operator<<(&local_1c8,(ChVector<double> *)local_228);
      pCVar10 = operator<<(pCVar10,(ChQuaternion<double> *)(local_228 + 0x18));
      CSV_writer::operator<<(pCVar10,&local_1e8);
      if (local_23c == 0) {
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)&local_260
                   ,(__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
                    (CONCAT62(local_250._2_6_,CONCAT11(local_250[1],local_250[0])) + 0x10));
        std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>
                  ((shared_ptr<chrono::ChMaterialSurface> *)&local_290);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
        pCVar10 = CSV_writer::operator<<(&local_1c8,&(local_290._M_ptr)->model_envelope);
        pCVar10 = CSV_writer::operator<<(pCVar10,&(local_290._M_ptr)->model_safe_margin);
        pCVar10 = CSV_writer::operator<<(pCVar10,(float *)&(local_290._M_ptr)->mcontactable);
        CSV_writer::operator<<(pCVar10,(float *)((long)&(local_290._M_ptr)->mcontactable + 4));
        pCVar10 = CSV_writer::operator<<(&local_1c8,(float *)&(local_290._M_ptr)->family_group);
        pCVar10 = CSV_writer::operator<<(pCVar10,(float *)&(local_290._M_ptr)->field_0x1c);
        CSV_writer::operator<<(pCVar10,(float *)&(local_290._M_ptr)->m_shapes);
        pCVar10 = CSV_writer::operator<<
                            (&local_1c8,
                             (float *)((long)&((local_290._M_ptr)->m_shapes).
                                              super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 4));
        pCVar10 = CSV_writer::operator<<
                            (pCVar10,(float *)&((local_290._M_ptr)->m_shapes).
                                               super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
        pCVar10 = CSV_writer::operator<<
                            (pCVar10,(float *)((long)&((local_290._M_ptr)->m_shapes).
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
        CSV_writer::operator<<
                  (pCVar10,(float *)&((local_290._M_ptr)->m_shapes).
                                     super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        CSV_writer::operator<<(&local_1c8,&local_1e8);
      }
      else {
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)&local_260
                   ,(__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
                    (CONCAT62(local_250._2_6_,CONCAT11(local_250[1],local_250[0])) + 0x10));
        std::static_pointer_cast<chrono::ChMaterialSurfaceSMC,chrono::ChMaterialSurface>
                  ((shared_ptr<chrono::ChMaterialSurface> *)&local_290);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
        pCVar10 = CSV_writer::operator<<(&local_1c8,(float *)&(local_290._M_ptr)->field_0x1c);
        CSV_writer::operator<<(pCVar10,(float *)&(local_290._M_ptr)->m_shapes);
        pCVar10 = CSV_writer::operator<<(&local_1c8,&(local_290._M_ptr)->model_envelope);
        CSV_writer::operator<<(pCVar10,&(local_290._M_ptr)->model_safe_margin);
        pCVar10 = CSV_writer::operator<<(&local_1c8,(float *)&(local_290._M_ptr)->family_group);
        pCVar10 = CSV_writer::operator<<
                            (pCVar10,(float *)((long)&((local_290._M_ptr)->m_shapes).
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
        CSV_writer::operator<<
                  (pCVar10,(float *)&((local_290._M_ptr)->m_shapes).
                                     super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
        pCVar10 = CSV_writer::operator<<
                            (&local_1c8,
                             (float *)&((local_290._M_ptr)->m_shapes).
                                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pCVar10 = CSV_writer::operator<<(pCVar10,(float *)(local_290._M_ptr + 1));
        pCVar10 = CSV_writer::operator<<
                            (pCVar10,(float *)((long)&((local_290._M_ptr)->m_shapes).
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4));
        CSV_writer::operator<<
                  (pCVar10,(float *)((long)&local_290._M_ptr[1]._vptr_ChCollisionModel + 4));
        CSV_writer::operator<<(&local_1c8,&local_1e8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_260,
                   &((local_278._M_ptr)->collision_model).
                    super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      plVar4 = (long *)CONCAT44(local_260._M_ptr._4_4_,
                                CONCAT22(local_260._M_ptr._2_2_,local_260._M_ptr._0_2_));
      (**(code **)(*plVar4 + 0x150))(&local_290,plVar4,uVar11);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
      _Var6._M_pi = local_290._M_refcount._M_pi;
      peVar5 = local_290._M_ptr;
      if (local_290._M_ptr == (element_type *)local_290._M_refcount._M_pi) {
        std::operator<<((ostream *)&std::cout,
                        "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n");
      }
      else {
        uVar1 = *(undefined4 *)(CONCAT62(local_250._2_6_,CONCAT11(local_250[1],local_250[0])) + 8);
        local_260._M_ptr._0_2_ = (undefined2)uVar1;
        local_260._M_ptr._2_2_ = (undefined2)((uint)uVar1 >> 0x10);
        pCVar10 = CSV_writer::operator<<(&local_1c8,(Type *)&local_260);
        operator<<(pCVar10,(vector<double,_std::allocator<double>_> *)&local_290);
        std::endl<char,std::char_traits<char>>((ostream *)&local_1c8.m_ss);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_290);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
      uVar11 = uVar11 + 1;
      if (peVar5 == (element_type *)_Var6._M_pi) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
        p_Var12 = local_238;
        p_Var13 = local_230;
        goto LAB_00e3b65d;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
    p_Var13 = local_230 + 1;
  } while( true );
}

Assistant:

bool WriteCheckpoint(ChSystem* system, const std::string& filename) {
    // Create the CSV stream.
    CSV_writer csv(" ");
    std::string tab("    ");

    // Write contact method type (0: NSC, 1: SMC)
    int ctype = (system->GetContactMethod() == ChContactMethod::NSC) ? 0 : 1;
    csv << ctype << std::endl;

    for (auto body : system->Get_bodylist()) {
        // Write body identifier, the body fixed flag, and the collide flag
        csv << body->GetIdentifier() << body->GetBodyFixed() << body->GetCollide() << tab;

        // Write collision family information.
        csv << body->GetCollisionModel()->GetFamilyGroup() << body->GetCollisionModel()->GetFamilyMask() << tab;

        // Write body mass and inertia
        csv << body->GetMass() << body->GetInertiaXX() << tab;

        // Write body position, orientation, and their time derivatives
        csv << body->GetPos() << body->GetRot() << tab;
        csv << body->GetPos_dt() << body->GetRot_dt() << tab;

        csv << std::endl;

        // Write number of collision shapes
        int n_shapes = body->GetCollisionModel()->GetNumShapes();
        csv << n_shapes << std::endl;

        // Loop over each shape and write its data on a separate line.
        // If we encounter an unsupported type, return false.
        for (int index = 0; index < n_shapes; index++) {
            auto shape = body->GetCollisionModel()->GetShape(index);

            // Write relative position and rotation
            ChCoordsys<> csys = body->GetCollisionModel()->GetShapePos(index);
            csv << csys.pos << csys.rot << tab;

            // Write shape material information
            if (ctype == 0) {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceNSC>(shape->GetMaterial());
                csv << mat->static_friction << mat->sliding_friction << mat->rolling_friction << mat->spinning_friction;
                csv << mat->restitution << mat->cohesion << mat->dampingf;
                csv << mat->compliance << mat->complianceT << mat->complianceRoll << mat->complianceSpin;
                csv << tab;
            } else {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceSMC>(shape->GetMaterial());
                csv << mat->young_modulus << mat->poisson_ratio;
                csv << mat->static_friction << mat->sliding_friction;
                csv << mat->restitution << mat->constant_adhesion << mat->adhesionMultDMT;
                csv << mat->kn << mat->gn << mat->kt << mat->gt;
                csv << tab;
            }

            // Write shape type and characteristic dimensions
            std::vector<double> dims = body->GetCollisionModel()->GetShapeDimensions(index);
            if (dims.empty()) {
                std::cout << "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n";
                return false;
            }

            csv << shape->GetType() << dims;

            csv << std::endl;
        }
    }

    csv.write_to_file(filename);

    return true;
}